

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

void __thiscall
clipp::usage_lines::write<std::__cxx11::ostringstream>
          (usage_lines *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  depth_first_traverser local_248;
  string local_228;
  formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  local_1d8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_1c0;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  int local_120;
  undefined4 uStack_11c;
  undefined8 uStack_118;
  undefined1 local_110;
  undefined1 uStack_10f;
  undefined2 uStack_10e;
  int iStack_10c;
  context local_100;
  
  local_208.curCol_ = 0;
  local_208.firstCol_ = (this->fmt_).firstCol_;
  if (local_208.firstCol_ < 1) {
    local_208.firstCol_ = 0;
  }
  local_208.lastCol_ = (this->fmt_).lastCol_;
  if (local_208.lastCol_ < 1) {
    local_208.lastCol_ = 0;
  }
  local_208.hangingIndent_ = (int)(this->prefix_)._M_string_length;
  if ((int)((double)(local_208.lastCol_ - local_208.firstCol_) * 0.4) <=
      local_208.firstCol_ + local_208.hangingIndent_) {
    local_208.hangingIndent_ = (this->fmt_).indentSize_;
  }
  local_208.paragraphSpacing_ = (this->fmt_).paragraphSpc_;
  local_208.paragraphSpacingThreshold_ = 2;
  local_208.curBlankLines_ = 0;
  local_208.curParagraphLines_ = 1;
  local_208.totalNonBlankLines_ = 0;
  local_208.ignoreInputNls_ = (this->fmt_).ignoreNewlines_;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_1c0._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_208.os_ = os;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&_Stack_1c0,0);
  local_170._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_170._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_170,0);
  local_120 = 0;
  uStack_118 = (group *)0x0;
  local_110 = 0;
  uStack_10f = 1;
  iStack_10c = 0;
  group::depth_first_traverser::depth_first_traverser(&local_248,this->cli_);
  pcVar3 = local_1d8.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar2 = local_1d8.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_248.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_248.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_248.stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_248.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)pcVar3 - (long)pcVar2);
    if (local_248.stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.stack_.
                      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_110 = 1;
  local_120 = (int)((ulong)((long)local_1d8.
                                  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1d8.
                                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  uStack_118 = this->cli_;
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::vector((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            *)&local_100,&local_1d8);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&local_100.separators.c,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&_Stack_1c0);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&local_100.postfixes.c,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_170);
  local_100.useOutermost = (bool)uStack_10f;
  local_100.linestart = (bool)local_110;
  local_100._202_2_ = uStack_10e;
  local_100.line = iStack_10c;
  local_100.level = local_120;
  local_100._188_4_ = uStack_11c;
  local_100.outermost._0_4_ = (undefined4)uStack_118;
  local_100.outermost._4_4_ = uStack_118._4_4_;
  pcVar1 = (this->prefix_)._M_dataplus._M_p;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,pcVar1,pcVar1 + (this->prefix_)._M_string_length);
  write<clipp::detail::formatting_ostream<std::__cxx11::ostringstream,std::__cxx11::string>>
            (this,&local_208,&local_100,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_100.postfixes.c);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_100.separators.c);
  if (local_100.pos.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.pos.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.pos.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.pos.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_170);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&_Stack_1c0);
  if (local_1d8.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void write(OStream& os) const
    {
        detail::formatting_ostream<OStream> fos(os);
        fos.first_column(fmt_.first_column());
        fos.last_column(fmt_.last_column());

        auto hindent = int(prefix_.size());
        if(fos.first_column() + hindent >= int(0.4 * fos.text_width())) {
            hindent = fmt_.indent_size();
        }
        fos.hanging_indent(hindent);

        fos.paragraph_spacing(fmt_.paragraph_spacing());
        fos.min_paragraph_lines_for_spacing(2);
        fos.ignore_newline_chars(fmt_.ignore_newline_chars());

        context cur;
        cur.pos = cli_.begin_dfs();
        cur.linestart = true;
        cur.level = cur.pos.level();
        cur.outermost = &cli_;

        write(fos, cur, prefix_);
    }